

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseIncoming.cpp
# Opt level: O1

Result __thiscall tonk::SessionIncoming::PostAcknowledgements(SessionIncoming *this)

{
  SiameseResult SVar1;
  RefCounter *pRVar2;
  Result *success;
  long in_RSI;
  uint ackBufferBytes;
  BandwidthShape shape;
  uint8_t data [1330];
  uint local_584;
  undefined1 *local_580;
  long local_578;
  undefined1 local_570 [16];
  BandwidthShape local_560;
  undefined4 local_558;
  undefined1 local_552 [1330];
  
  if (*(int *)(in_RSI + 0x274) == *(int *)(in_RSI + 0x270)) {
    (this->Deps).ConnectionRef = (RefCounter *)0x0;
  }
  else {
    local_558 = *(int *)(in_RSI + 0x250) + 1;
    local_560 = *(BandwidthShape *)(*(long *)(in_RSI + 0x20) + 0xa0);
    BandwidthShape::Compress(&local_560,(uint8_t *)((long)&local_558 + 3));
    local_584 = 0;
    SVar1 = siamese_decoder_ack(*(SiameseDecoder *)(in_RSI + 0x268),local_552,0x52c,&local_584);
    if ((SVar1 & ~Siamese_NeedMoreData) == Siamese_Success) {
      *(undefined1 *)(*(long *)(in_RSI + 0x20) + 0xa8) = 0;
      (**(code **)(**(long **)(in_RSI + 0x18) + 0x10))
                (this,*(long **)(in_RSI + 0x18),1,&local_558,local_584 + 6);
    }
    else {
      local_580 = local_570;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_580,"siamese_decoder_ack failed","");
      pRVar2 = (RefCounter *)operator_new(0x38);
      *(char **)pRVar2 = "SessionIncoming::PostAcknowledgements";
      (pRVar2->ShutdownJson)._M_dataplus._M_p = (pointer)&(pRVar2->ShutdownJson).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&pRVar2->ShutdownJson,local_580,local_580 + local_578);
      (pRVar2->RefCount).super___atomic_base<int>._M_i = 1;
      *(long *)&(pRVar2->ShutdownLock).super___mutex_base._M_mutex = (long)(int)SVar1;
      (this->Deps).ConnectionRef = pRVar2;
      if (local_580 != local_570) {
        operator_delete(local_580);
      }
    }
  }
  return (Result)(ErrorResult *)this;
}

Assistant:

Result SessionIncoming::PostAcknowledgements()
{
    //AckRequired = false;

    // Check if the receiver has already got this ack
    if (LastAckAckSeq == FECNextExpectedPacketNum) {
        return Result::Success();
    }

    // Generate decoder ack data
    uint8_t data[protocol::kMinPossibleDatagramByteLimit];

    // Write NextExpectedNonce to the front (truncated)
    siamese::WriteU24_LE_Min4Bytes(data, GetNextExpectedNonce24());

    // Calculate sender shape to deliver to remote peer
    const BandwidthShape shape = Deps.ReceiverControl->GetSenderShape();
    shape.Compress(data + 3);

    // Append acknowledgement data
    unsigned ackBufferBytes = 0;
    const int ackResult = siamese_decoder_ack(
        FECDecoder,
        data + kAckOverheadBytes,
        protocol::kMinPossibleDatagramByteLimit - kAckOverheadBytes,
        &ackBufferBytes);

    if (ackResult == Siamese_NeedMoreData) {
        // No datagrams received yet
        TONK_DEBUG_ASSERT(ackBufferBytes == 0);
    }
    else if (ackResult != Siamese_Success) {
        return Result("SessionIncoming::PostAcknowledgements", "siamese_decoder_ack failed", ErrorType::Siamese, ackResult);
    }

    // Let the bandwidth control subsystem know we sent an ack
    Deps.ReceiverControl->OnSendAck();

    return Deps.Outgoing->QueueUnreliable(
        protocol::MessageType_Acknowledgements,
        data,
        kAckOverheadBytes + ackBufferBytes);
}